

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

pointer __thiscall
google::protobuf::RepeatedField<unsigned_long>::Add(RepeatedField<unsigned_long> *this)

{
  ulong uVar1;
  bool is_soo;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    iVar3 = 1;
  }
  else {
    iVar3 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar2 == iVar3) {
    Grow(this,(uVar1 & 4) == 0,iVar2,iVar2 + 1);
  }
  else if ((uVar1 & 4) == 0) {
    pcVar4 = (char *)((long)&(this->soo_rep_).field_0 + 8);
    is_soo = true;
    goto LAB_00c8fb6f;
  }
  pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
  is_soo = false;
LAB_00c8fb6f:
  iVar2 = ExchangeCurrentSize(this,is_soo,iVar2 + 1);
  return (pointer)(pcVar4 + (long)iVar2 * 8);
}

Assistant:

inline Element* RepeatedField<Element>::Add() ABSL_ATTRIBUTE_LIFETIME_BOUND {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  if (ABSL_PREDICT_FALSE(old_size == Capacity())) {
    Grow(is_soo, old_size, old_size + 1);
    is_soo = false;
  }
  void* p = unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + 1);
  return ::new (p) Element;
}